

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::FindLastString(char *str1,char *str2)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  char *local_38;
  char *ptr;
  size_t len2;
  size_t len1;
  char *str2_local;
  char *str1_local;
  
  if ((str1 != (char *)0x0) && (str2 != (char *)0x0)) {
    sVar2 = strlen(str1);
    __n = strlen(str2);
    if (__n <= sVar2) {
      local_38 = str1 + (sVar2 - __n);
      do {
        iVar1 = strncmp(local_38,str2,__n);
        if (iVar1 == 0) {
          return local_38;
        }
        bVar3 = local_38 != str1;
        local_38 = local_38 + -1;
      } while (bVar3);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* SystemTools::FindLastString(const char* str1, const char* str2)
{
  if (!str1 || !str2)
    {
    return NULL;
    }

  size_t len1 = strlen(str1), len2 = strlen(str2);
  if (len1 >= len2)
    {
    const char *ptr = str1 + len1 - len2;
    do
      {
      if (!strncmp(ptr, str2, len2))
        {
        return ptr;
        }
      } while (ptr-- != str1);
    }

  return NULL;
}